

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int simpleOpen(sqlite3_tokenizer *pTokenizer,char *pInput,int nBytes,
              sqlite3_tokenizer_cursor **ppCursor)

{
  int iVar1;
  int iVar2;
  sqlite3_tokenizer_cursor *psVar3;
  size_t sVar4;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    psVar3 = (sqlite3_tokenizer_cursor *)sqlite3Malloc(0x30);
  }
  else {
    psVar3 = (sqlite3_tokenizer_cursor *)0x0;
  }
  if (psVar3 == (sqlite3_tokenizer_cursor *)0x0) {
    iVar1 = 7;
  }
  else {
    psVar3[1].pTokenizer = (sqlite3_tokenizer *)pInput;
    iVar1 = 0;
    iVar2 = 0;
    if ((pInput != (char *)0x0) && (iVar2 = nBytes, nBytes < 0)) {
      sVar4 = strlen(pInput);
      iVar2 = (int)sVar4;
    }
    *(int *)&psVar3[2].pTokenizer = iVar2;
    *(undefined8 *)((long)&psVar3[2].pTokenizer + 4) = 0;
    psVar3[4].pTokenizer = (sqlite3_tokenizer *)0x0;
    *(undefined4 *)&psVar3[5].pTokenizer = 0;
    *ppCursor = psVar3;
  }
  return iVar1;
}

Assistant:

static int simpleOpen(
  sqlite3_tokenizer *pTokenizer,         /* The tokenizer */
  const char *pInput, int nBytes,        /* String to be tokenized */
  sqlite3_tokenizer_cursor **ppCursor    /* OUT: Tokenization cursor */
){
  simple_tokenizer_cursor *c;

  UNUSED_PARAMETER(pTokenizer);

  c = (simple_tokenizer_cursor *) sqlite3_malloc(sizeof(*c));
  if( c==NULL ) return SQLITE_NOMEM;

  c->pInput = pInput;
  if( pInput==0 ){
    c->nBytes = 0;
  }else if( nBytes<0 ){
    c->nBytes = (int)strlen(pInput);
  }else{
    c->nBytes = nBytes;
  }
  c->iOffset = 0;                 /* start tokenizing at the beginning */
  c->iToken = 0;
  c->pToken = NULL;               /* no space allocated, yet. */
  c->nTokenAllocated = 0;

  *ppCursor = &c->base;
  return SQLITE_OK;
}